

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O2

CURLcode curl_easy_perform(Curl_easy *data)

{
  char *pcVar1;
  CURLMcode CVar2;
  CURLMcode CVar3;
  Curl_multi *multi;
  CURLMsg *pCVar4;
  CURLcode result;
  CURLcode CVar5;
  CURLMcode mcode;
  bool bVar6;
  int still_running;
  int local_d4;
  sigpipe_ignore pipe_st;
  
  if (data == (Curl_easy *)0x0) {
    CVar5 = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  else {
    pcVar1 = (data->set).errorbuffer;
    if (pcVar1 != (char *)0x0) {
      *pcVar1 = '\0';
    }
    if (data->multi == (Curl_multi *)0x0) {
      multi = data->multi_easy;
      if (multi == (Curl_multi *)0x0) {
        multi = Curl_multi_handle(1,3,7);
        if (multi == (Curl_multi *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        data->multi_easy = multi;
      }
      if ((multi->field_0x1b1 & 4) == 0) {
        CVar3 = CURLM_OK;
        curl_multi_setopt(multi,CURLMOPT_MAXCONNECTS,(ulong)(data->set).maxconnects);
        CVar2 = curl_multi_add_handle(multi,data);
        if (CVar2 == CURLM_OK) {
          sigpipe_ignore(data,&pipe_st);
          CVar5 = CURLE_OK;
          do {
            bVar6 = false;
            while( true ) {
              if ((CVar3 != CURLM_OK) || (bVar6)) {
                if (CVar3 != CURLM_OK) {
                  CVar5 = (uint)(CVar3 != CURLM_OUT_OF_MEMORY) * 0x10 + CURLE_OUT_OF_MEMORY;
                }
                curl_multi_remove_handle(multi,data);
                sigpipe_restore(&pipe_st);
                return CVar5;
              }
              still_running = 0;
              CVar3 = curl_multi_poll(multi,(curl_waitfd *)0x0,0,1000,(int *)0x0);
              if (CVar3 == CURLM_OK) {
                CVar3 = curl_multi_perform(multi,&still_running);
              }
              if (still_running != 0 || CVar3 != CURLM_OK) break;
              pCVar4 = curl_multi_info_read(multi,&local_d4);
              bVar6 = pCVar4 != (CURLMsg *)0x0;
              if (bVar6) {
                CVar5 = (pCVar4->data).result;
              }
            }
          } while( true );
        }
        curl_multi_cleanup(multi);
        data->multi_easy = (Curl_multi *)0x0;
        CVar5 = CURLE_OUT_OF_MEMORY;
        if (CVar2 != CURLM_OUT_OF_MEMORY) {
          CVar5 = CURLE_FAILED_INIT;
        }
      }
      else {
        CVar5 = CURLE_RECURSIVE_API_CALL;
      }
    }
    else {
      Curl_failf(data,"easy handle already used in multi handle");
      CVar5 = CURLE_FAILED_INIT;
    }
  }
  return CVar5;
}

Assistant:

static CURLcode easy_perform(struct Curl_easy *data, bool events)
{
  struct Curl_multi *multi;
  CURLMcode mcode;
  CURLcode result = CURLE_OK;
  SIGPIPE_VARIABLE(pipe_st);

  if(!data)
    return CURLE_BAD_FUNCTION_ARGUMENT;

  if(data->set.errorbuffer)
    /* clear this as early as possible */
    data->set.errorbuffer[0] = 0;

  if(data->multi) {
    failf(data, "easy handle already used in multi handle");
    return CURLE_FAILED_INIT;
  }

  if(data->multi_easy)
    multi = data->multi_easy;
  else {
    /* this multi handle will only ever have a single easy handled attached
       to it, so make it use minimal hashes */
    multi = Curl_multi_handle(1, 3, 7);
    if(!multi)
      return CURLE_OUT_OF_MEMORY;
    data->multi_easy = multi;
  }

  if(multi->in_callback)
    return CURLE_RECURSIVE_API_CALL;

  /* Copy the MAXCONNECTS option to the multi handle */
  curl_multi_setopt(multi, CURLMOPT_MAXCONNECTS, (long)data->set.maxconnects);

  mcode = curl_multi_add_handle(multi, data);
  if(mcode) {
    curl_multi_cleanup(multi);
    data->multi_easy = NULL;
    if(mcode == CURLM_OUT_OF_MEMORY)
      return CURLE_OUT_OF_MEMORY;
    return CURLE_FAILED_INIT;
  }

  sigpipe_ignore(data, &pipe_st);

  /* run the transfer */
  result = events ? easy_events(multi) : easy_transfer(multi);

  /* ignoring the return code isn't nice, but atm we can't really handle
     a failure here, room for future improvement! */
  (void)curl_multi_remove_handle(multi, data);

  sigpipe_restore(&pipe_st);

  /* The multi handle is kept alive, owned by the easy handle */
  return result;
}